

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NavMoveRequestResolveWithLastItem(ImGuiNavItemData *result)

{
  bool *pbVar1;
  ImGuiContext *pIVar2;
  
  GImGui->NavMoveScoringItems = false;
  NavApplyItemToResult(result);
  pIVar2 = GImGui;
  if (GImGui->NavMoveScoringItems == false) {
    pbVar1 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar1;
    if (*pbVar1 == false) {
      return;
    }
  }
  else {
    GImGui->NavAnyRequest = true;
  }
  if (pIVar2->NavWindow != (ImGuiWindow *)0x0) {
    return;
  }
  __assert_fail("g.NavWindow != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                ,0x2742,"void ImGui::NavUpdateAnyRequestFlag()");
}

Assistant:

void ImGui::NavMoveRequestResolveWithLastItem(ImGuiNavItemData* result)
{
    ImGuiContext& g = *GImGui;
    g.NavMoveScoringItems = false; // Ensure request doesn't need more processing
    NavApplyItemToResult(result);
    NavUpdateAnyRequestFlag();
}